

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

bool __thiscall
crnlib::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  vector<unsigned_char> *this_00;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  params *ppVar4;
  color_quad_u8 *pcVar5;
  uchar *puVar6;
  uint uVar7;
  potential_solution *ppVar8;
  potential_solution *ppVar9;
  undefined4 *puVar10;
  uchar uVar11;
  uint s;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int result;
  uint uVar17;
  int result_2;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uchar uVar24;
  int result_1;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  color_quad_u8 block_colors [4];
  byte local_c8 [24];
  potential_solution *local_b0;
  uint64 *local_a8;
  etc1_optimizer *local_a0;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  potential_solution *local_68;
  ulong local_60;
  etc1_solution_coordinates *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  undefined4 *local_38;
  
  trial_solution->m_valid = false;
  ppVar4 = this->m_pParams;
  bVar1 = (coords->m_unscaled_color).field_0.field_0.r;
  uVar17 = (uint)bVar1;
  if (ppVar4->m_constrain_against_base_color5 == true) {
    iVar28 = uVar17 - (ppVar4->m_base_color5).field_0.field_0.r;
    iVar25 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar4->m_base_color5).field_0.field_0.g;
    iVar22 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar4->m_base_color5).field_0.field_0.b;
    iVar12 = iVar25;
    if (iVar28 < iVar25) {
      iVar12 = iVar28;
    }
    if (iVar22 <= iVar12) {
      iVar12 = iVar22;
    }
    if (iVar12 < -4) {
      return false;
    }
    if (iVar25 < iVar28) {
      iVar25 = iVar28;
    }
    if (iVar25 <= iVar22) {
      iVar25 = iVar22;
    }
    if (3 < iVar25) {
      return false;
    }
  }
  if (coords->m_color4 == true) {
    uVar17 = uVar17 << 4 | uVar17;
    uVar26 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
    uVar26 = uVar26 << 4 | uVar26;
    local_94 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
    local_94 = local_94 << 4 | local_94;
  }
  else {
    uVar17 = uVar17 << 3 | (uint)(bVar1 >> 2);
    bVar1 = (coords->m_unscaled_color).field_0.field_0.g;
    uVar26 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
    bVar1 = (coords->m_unscaled_color).field_0.field_0.b;
    local_94 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
  }
  if (0xfe < uVar17) {
    uVar17 = 0xff;
  }
  local_50 = (ulong)uVar17;
  if (0xfe < uVar26) {
    uVar26 = 0xff;
  }
  local_48 = (ulong)uVar26;
  if (0xfe < local_94) {
    local_94 = 0xff;
  }
  local_60 = (ulong)ppVar4->m_num_src_pixels;
  local_a8 = &trial_solution->m_error;
  trial_solution->m_error = 0xffffffffffffffff;
  lVar13 = 0;
  puVar10 = &g_etc1_inten_tables;
  do {
    local_38 = puVar10;
    local_40 = lVar13;
    lVar13 = 0;
    do {
      iVar12 = local_38[lVar13];
      uVar16 = iVar12 + uVar17;
      uVar19 = iVar12 + uVar26;
      uVar15 = iVar12 + local_94;
      uVar20 = 0xff;
      if (uVar16 < 0xff) {
        uVar20 = uVar16;
      }
      bVar1 = (byte)uVar20;
      if ((int)uVar16 < 0) {
        bVar1 = 0;
      }
      uVar20 = 0xff;
      if (uVar19 < 0xff) {
        uVar20 = uVar19;
      }
      local_c8[lVar13 * 4] = bVar1;
      bVar1 = (byte)uVar20;
      if ((int)uVar19 < 0) {
        bVar1 = 0;
      }
      uVar20 = 0xff;
      if (uVar15 < 0xff) {
        uVar20 = uVar15;
      }
      bVar18 = (byte)uVar20;
      local_c8[lVar13 * 4 + 1] = bVar1;
      if ((int)uVar15 < 0) {
        bVar18 = 0;
      }
      local_c8[lVar13 * 4 + 2] = bVar18;
      local_c8[lVar13 * 4 + 3] = 0;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    if (local_60 == 0) {
      uVar14 = *local_a8;
      uVar21 = 0;
    }
    else {
      pcVar5 = this->m_pParams->m_pSrc_pixels;
      local_6c = (uint)local_c8[0];
      local_70 = (uint)local_c8[1];
      local_74 = (uint)local_c8[2];
      local_78 = (uint)local_c8[4];
      local_7c = (uint)local_c8[5];
      local_80 = (uint)local_c8[6];
      local_84 = (uint)local_c8[8];
      local_88 = (uint)local_c8[9];
      local_8c = (uint)local_c8[10];
      local_90 = (uint)local_c8[0xc];
      uVar21 = 0;
      uVar30 = 1;
      do {
        bVar1 = pcVar5[uVar30 - 1].field_0.field_0.r;
        uVar29 = (uint)bVar1;
        bVar18 = pcVar5[uVar30 - 1].field_0.field_0.g;
        uVar27 = (uint)bVar18;
        bVar2 = pcVar5[uVar30 - 1].field_0.field_0.b;
        uVar19 = (uint)bVar2;
        uVar16 = (uVar19 - local_74) * (uVar19 - local_74) +
                 (uVar27 - local_70) * (uVar27 - local_70) +
                 (uVar29 - local_6c) * (uVar29 - local_6c);
        iVar12 = bVar1 - local_78;
        iVar22 = bVar18 - local_7c;
        iVar25 = bVar2 - local_80;
        uVar15 = iVar25 * iVar25 + iVar22 * iVar22 + iVar12 * iVar12;
        uVar20 = uVar15;
        if (uVar15 >= uVar16) {
          uVar20 = uVar16;
        }
        uVar23 = (uVar19 - local_8c) * (uVar19 - local_8c) +
                 (uVar27 - local_88) * (uVar27 - local_88) +
                 (uVar29 - local_84) * (uVar29 - local_84);
        uVar7 = uVar23;
        if (uVar20 <= uVar23) {
          uVar7 = uVar20;
        }
        uVar24 = uVar15 < uVar16;
        if (uVar20 > uVar23) {
          uVar24 = '\x02';
        }
        uVar20 = (uVar19 - local_c8[0xe]) * (uVar19 - local_c8[0xe]) +
                 (uVar27 - local_c8[0xd]) * (uVar27 - local_c8[0xd]) +
                 (uVar29 - local_90) * (uVar29 - local_90);
        uVar11 = '\x03';
        if (uVar7 <= uVar20) {
          uVar20 = uVar7;
          uVar11 = uVar24;
        }
        (this->m_temp_selectors).m_p[uVar30 - 1] = uVar11;
        uVar21 = uVar20 + uVar21;
        uVar14 = *local_a8;
      } while ((uVar21 < uVar14) && (bVar31 = uVar30 < local_60, uVar30 = uVar30 + 1, bVar31));
    }
    if (uVar21 < uVar14) {
      trial_solution->m_error = uVar21;
      (trial_solution->m_coords).m_inten_table = (uint)local_40;
      puVar6 = (trial_solution->m_selectors).m_p;
      (trial_solution->m_selectors).m_p = (this->m_temp_selectors).m_p;
      (this->m_temp_selectors).m_p = puVar6;
      uVar3 = (trial_solution->m_selectors).m_size;
      (trial_solution->m_selectors).m_size = (this->m_temp_selectors).m_size;
      (this->m_temp_selectors).m_size = uVar3;
      uVar3 = (trial_solution->m_selectors).m_capacity;
      (trial_solution->m_selectors).m_capacity = (this->m_temp_selectors).m_capacity;
      (this->m_temp_selectors).m_capacity = uVar3;
      trial_solution->m_valid = true;
    }
    lVar13 = local_40 + 1;
    puVar10 = local_38 + 4;
  } while (local_40 + 1 != 8);
  uVar24 = (coords->m_unscaled_color).field_0.field_0.r;
  (trial_solution->m_coords).m_unscaled_color.field_0.field_0.r = uVar24;
  (trial_solution->m_coords).m_unscaled_color.field_0.field_0.g =
       (coords->m_unscaled_color).field_0.field_0.g;
  (trial_solution->m_coords).m_unscaled_color.field_0.field_0.b =
       (coords->m_unscaled_color).field_0.field_0.b;
  (trial_solution->m_coords).m_unscaled_color.field_0.field_0.a =
       (coords->m_unscaled_color).field_0.field_0.a;
  (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
  if ((pBest_solution != (potential_solution *)0x0) && (*local_a8 < pBest_solution->m_error)) {
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.r = uVar24;
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.g =
         (trial_solution->m_coords).m_unscaled_color.field_0.field_0.g;
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.b =
         (trial_solution->m_coords).m_unscaled_color.field_0.field_0.b;
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.a =
         (trial_solution->m_coords).m_unscaled_color.field_0.field_0.a;
    (pBest_solution->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
    (pBest_solution->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
    if (pBest_solution != trial_solution) {
      uVar17 = (trial_solution->m_selectors).m_size;
      local_b0 = trial_solution;
      local_a0 = this;
      local_68 = pBest_solution;
      local_58 = coords;
      if ((pBest_solution->m_selectors).m_capacity < uVar17) {
        this_00 = &pBest_solution->m_selectors;
        if (this_00->m_p != (uchar *)0x0) {
          crnlib_free(this_00->m_p);
          this_00->m_p = (uchar *)0x0;
          (pBest_solution->m_selectors).m_size = 0;
          (pBest_solution->m_selectors).m_capacity = 0;
          uVar17 = (local_b0->m_selectors).m_size;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar17,false,1,(object_mover)0x0,false);
      }
      else if ((pBest_solution->m_selectors).m_size != 0) {
        (pBest_solution->m_selectors).m_size = 0;
      }
      ppVar9 = local_68;
      ppVar8 = local_b0;
      memcpy((local_68->m_selectors).m_p,(local_b0->m_selectors).m_p,
             (ulong)(local_b0->m_selectors).m_size);
      (ppVar9->m_selectors).m_size = (ppVar8->m_selectors).m_size;
    }
    pBest_solution->m_valid = *(bool *)(local_a8 + 1);
    pBest_solution->m_error = *local_a8;
    return true;
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = m_pParams->m_num_src_pixels;
  CRNLIB_ASSERT(trial_solution.m_selectors.size() == n);

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = math::square(src_pixel.r - block_colors[0].r) + math::square(src_pixel.g - block_colors[0].g) + math::square(src_pixel.b - block_colors[0].b);

      uint trial_error = math::square(src_pixel.r - block_colors[1].r) + math::square(src_pixel.g - block_colors[1].g) + math::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = math::square(src_pixel.r - block_colors[2].r) + math::square(src_pixel.g - block_colors[2].g) + math::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = math::square(src_pixel.r - block_colors[3].r) + math::square(src_pixel.g - block_colors[3].g) + math::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      trial_solution.m_selectors.swap(m_temp_selectors);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}